

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void take_aarch32_exception
               (CPUARMState_conflict *env,int new_mode,uint32_t mask,uint32_t offset,uint32_t newpc)

{
  _Bool _Var1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  switch_mode(env,new_mode);
  uVar4 = env->uncached_cpsr;
  env->uncached_cpsr = uVar4 & 0xffdfffff;
  uVar2 = cpsr_read_aarch64(env);
  env->spsr = uVar2;
  env->condexec_bits = 0;
  env->uncached_cpsr = uVar4 & 0xffdfffe0 | new_mode;
  iVar3 = arm_current_el(env);
  uVar4 = env->uncached_cpsr;
  env->uncached_cpsr = uVar4 & 0xfffffdff;
  env->uncached_cpsr =
       uVar4 & 0xfeeffdff | (uint)(env->cp15).cptr_el[(long)iVar3 + -5] >> 0x10 & 0x200;
  env->daif = env->daif | (ulong)mask;
  if (new_mode == 0x1a) {
    env->thumb = *(uint *)((long)&(env->cp15).field_2 + 0x10) >> 0x1e & 1;
    env->elr_el[2] = (ulong)env->regs[0xf];
    goto LAB_005b03e8;
  }
  uVar2 = extract32((uint32_t)env[1].xregs[0xc],0x10,4);
  if (uVar2 != 0) {
    if (iVar3 == 1) {
LAB_005b0379:
      if ((*(byte *)((long)(env->cp15).cptr_el + (long)iVar3 * 8 + -0x26) & 0x80) == 0) {
        uVar4 = env->uncached_cpsr | 0x400000;
LAB_005b039e:
        env->uncached_cpsr = uVar4;
      }
    }
    else if (iVar3 == 3) {
      if (((env->features & 0x200000000) != 0) && (((env->cp15).scr_el3 & 1) == 0))
      goto LAB_005b0379;
      uVar4 = env->uncached_cpsr & 0xffbfffff;
      goto LAB_005b039e;
    }
  }
  if ((env->features & 0x4000) != 0) {
    _Var1 = arm_is_secure(env);
    if ((!_Var1) || (lVar5 = 0x2b8, (env->features & 0x10000000) != 0)) {
      lVar5 = 0x2a8;
    }
    env->thumb = *(uint *)((long)env->regs + lVar5) >> 0x1e & 1;
  }
  env->regs[0xe] = offset + env->regs[0xf];
LAB_005b03e8:
  env->regs[0xf] = newpc;
  arm_rebuild_hflags_aarch64(env);
  return;
}

Assistant:

static void take_aarch32_exception(CPUARMState *env, int new_mode,
                                   uint32_t mask, uint32_t offset,
                                   uint32_t newpc)
{
    int new_el;

    /* Change the CPU state so as to actually take the exception. */
    switch_mode(env, new_mode);

    /*
     * For exceptions taken to AArch32 we must clear the SS bit in both
     * PSTATE and in the old-state value we save to SPSR_<mode>, so zero it now.
     */
    env->uncached_cpsr &= ~PSTATE_SS;
    env->spsr = cpsr_read(env);
    /* Clear IT bits.  */
    env->condexec_bits = 0;
    /* Switch to the new mode, and to the correct instruction set.  */
    env->uncached_cpsr = (env->uncached_cpsr & ~CPSR_M) | new_mode;

    /* This must be after mode switching. */
    new_el = arm_current_el(env);

    /* Set new mode endianness */
    env->uncached_cpsr &= ~CPSR_E;
    if (env->cp15.sctlr_el[new_el] & SCTLR_EE) {
        env->uncached_cpsr |= CPSR_E;
    }
    /* J and IL must always be cleared for exception entry */
    env->uncached_cpsr &= ~(CPSR_IL | CPSR_J);
    env->daif |= mask;

    if (new_mode == ARM_CPU_MODE_HYP) {
        env->thumb = (env->cp15.sctlr_el[2] & SCTLR_TE) != 0;
        env->elr_el[2] = env->regs[15];
    } else {
        /* CPSR.PAN is normally preserved preserved unless...  */
        if (cpu_isar_feature(aa32_pan, env_archcpu(env))) {
            switch (new_el) {
            case 3:
                if (!arm_is_secure_below_el3(env)) {
                    /* ... the target is EL3, from non-secure state.  */
                    env->uncached_cpsr &= ~CPSR_PAN;
                    break;
                }
                /* ... the target is EL3, from secure state ... */
                /* fall through */
            case 1:
                /* ... the target is EL1 and SCTLR.SPAN is 0.  */
                if (!(env->cp15.sctlr_el[new_el] & SCTLR_SPAN)) {
                    env->uncached_cpsr |= CPSR_PAN;
                }
                break;
            }
        }
        /*
         * this is a lie, as there was no c1_sys on V4T/V5, but who cares
         * and we should just guard the thumb mode on V4
         */
        if (arm_feature(env, ARM_FEATURE_V4T)) {
            env->thumb =
                (A32_BANKED_CURRENT_REG_GET(env, sctlr) & SCTLR_TE) != 0;
        }
        env->regs[14] = env->regs[15] + offset;
    }
    env->regs[15] = newpc;
    arm_rebuild_hflags(env);
}